

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# reporter.c
# Opt level: O0

void destroy_reporter(TestReporter *reporter)

{
  TestReporter *in_RDI;
  
  destroy_breadcrumb((CgreenBreadcrumb *)0x10f2f2);
  destroy_memo((TestReportMemo *)0x10f302);
  free(in_RDI);
  if (context.reporter == in_RDI) {
    context.reporter = (TestReporter *)0x0;
  }
  return;
}

Assistant:

void destroy_reporter(TestReporter *reporter) {
    destroy_breadcrumb((CgreenBreadcrumb *)reporter->breadcrumb);
    destroy_memo((TestReportMemo *)reporter->memo);
    free(reporter);
    // hack to allow destroy_reporter to be called in reporter_tests when
    // tests are running in same process
    if (context.reporter == reporter)
    {
        context.reporter = NULL;
    }
}